

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

int Abc_SclComputeReverseLevel(Abc_Obj_t *pObj)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar1 = (pObj->vFanouts).nSize;
  uVar3 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  uVar1 = 0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    uVar4 = *(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[uVar3]] + 0x14) >> 0xc
    ;
    if (uVar1 <= uVar4) {
      uVar1 = uVar4;
    }
  }
  return uVar1 + 1;
}

Assistant:

int Abc_SclComputeReverseLevel( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i, Level = 0;
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Level = Abc_MaxInt( Level, pFanout->Level );
    return Level + 1;
}